

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderReuseTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::builder_reusable_after_release_test(TestSelector *selector)

{
  pointer pDVar1;
  Offset<MyGame::Example::Monster> root;
  int iVar2;
  size_type sVar3;
  char *in_RCX;
  size_t in_R8;
  long lVar4;
  vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_> buffers;
  DetachedBuffer local_e0;
  FlatBufferBuilderImpl<false> fbb;
  
  fbb.buf_.allocator_ = (Allocator *)CONCAT44(fbb.buf_.allocator_._4_4_,1);
  sVar3 = std::
          set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
          ::count(selector,(key_type *)&fbb);
  if (sVar3 != 0) {
    fbb.buf_.allocator_ = (Allocator *)0x0;
    fbb.buf_.own_allocator_ = false;
    fbb.buf_.initial_size_ = 0x400;
    fbb.buf_.max_size_ = 0x7fffffff;
    fbb.buf_.buffer_minalign_ = 8;
    fbb.buf_.reserved_ = 0;
    fbb.buf_.size_ = 0;
    fbb.length_of_64_bit_region_ = 0;
    fbb.nested = false;
    fbb.finished = false;
    fbb.buf_.buf_ = (uint8_t *)0x0;
    fbb.buf_.cur_._0_6_ = 0;
    fbb.buf_.cur_._6_2_ = 0;
    fbb.buf_.scratch_._0_6_ = 0;
    fbb._78_8_ = 0;
    fbb.minalign_ = 1;
    fbb.force_defaults_ = false;
    fbb.dedup_vtables_ = true;
    fbb.string_pool = (StringOffsetMap *)0x0;
    buffers.
    super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffers.
    super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buffers.
    super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar4 = 0; lVar4 != 0xf0; lVar4 = lVar4 + 0x30) {
      root = populate1(&fbb);
      flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
                (&fbb,root,(char *)0x0);
      flatbuffers::FlatBufferBuilderImpl<false>::Release(&local_e0,&fbb);
      std::vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>::
      emplace_back<flatbuffers::DetachedBuffer>(&buffers,&local_e0);
      flatbuffers::DetachedBuffer::~DetachedBuffer(&local_e0);
      pDVar1 = buffers.
               super__Vector_base<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      m1_name_abi_cxx11_();
      iVar2 = verify((EVP_PKEY_CTX *)((long)&pDVar1->allocator_ + lVar4),(uchar *)&local_e0,1,
                     (uchar *)in_RCX,in_R8);
      in_RCX = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h";
      in_R8 = 0xef;
      TestEq<bool,bool>(true,SUB41(iVar2,0),
                        "\'true\' != \'verify(buffers[i], m1_name(), m1_color())\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                        ,0xef,
                        "static void BuilderReuseTests<flatbuffers::FlatBufferBuilderImpl<>, flatbuffers::FlatBufferBuilderImpl<>>::builder_reusable_after_release_test(TestSelector) [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
                       );
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::vector<flatbuffers::DetachedBuffer,_std::allocator<flatbuffers::DetachedBuffer>_>::~vector
              (&buffers);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&fbb);
  }
  return;
}

Assistant:

static void builder_reusable_after_release_test(TestSelector selector) {
    if (!selector.count(REUSABLE_AFTER_RELEASE)) { return; }

    DestBuilder fbb;
    std::vector<flatbuffers::DetachedBuffer> buffers;
    for (int i = 0; i < 5; ++i) {
      auto root_offset1 = populate1(fbb);
      fbb.Finish(root_offset1);
      buffers.push_back(fbb.Release());
      TEST_ASSERT_FUNC(verify(buffers[i], m1_name(), m1_color()));
    }
  }